

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-stb-truetype.h
# Opt level: O0

void stbtt_GetGlyphHMetrics
               (stbtt_fontinfo *info,int glyph_index,int *advanceWidth,int *leftSideBearing)

{
  stbtt_uint16 sVar1;
  stbtt_int16 sVar2;
  stbtt_uint16 numOfLongHorMetrics;
  int *leftSideBearing_local;
  int *advanceWidth_local;
  int glyph_index_local;
  stbtt_fontinfo *info_local;
  
  sVar1 = ttUSHORT(info->data + (long)info->hhea + 0x22);
  if (glyph_index < (int)(uint)sVar1) {
    if (advanceWidth != (int *)0x0) {
      sVar2 = ttSHORT(info->data + (long)(glyph_index << 2) + (long)info->hmtx);
      *advanceWidth = (int)sVar2;
    }
    if (leftSideBearing != (int *)0x0) {
      sVar2 = ttSHORT(info->data + (long)(glyph_index << 2) + (long)info->hmtx + 2);
      *leftSideBearing = (int)sVar2;
    }
  }
  else {
    if (advanceWidth != (int *)0x0) {
      sVar2 = ttSHORT(info->data + (long)(int)((sVar1 - 1) * 4) + (long)info->hmtx);
      *advanceWidth = (int)sVar2;
    }
    if (leftSideBearing != (int *)0x0) {
      sVar2 = ttSHORT(info->data +
                      (long)(int)((glyph_index - (uint)sVar1) * 2) +
                      (long)(int)((uint)sVar1 << 2) + (long)info->hmtx);
      *leftSideBearing = (int)sVar2;
    }
  }
  return;
}

Assistant:

STBTT_DEF void stbtt_GetGlyphHMetrics(const stbtt_fontinfo *info, int glyph_index, int *advanceWidth, int *leftSideBearing)
{
   stbtt_uint16 numOfLongHorMetrics = ttUSHORT(info->data+info->hhea + 34);
   if (glyph_index < numOfLongHorMetrics) {
      if (advanceWidth)     *advanceWidth    = ttSHORT(info->data + info->hmtx + 4*glyph_index);
      if (leftSideBearing)  *leftSideBearing = ttSHORT(info->data + info->hmtx + 4*glyph_index + 2);
   } else {
      if (advanceWidth)     *advanceWidth    = ttSHORT(info->data + info->hmtx + 4*(numOfLongHorMetrics-1));
      if (leftSideBearing)  *leftSideBearing = ttSHORT(info->data + info->hmtx + 4*numOfLongHorMetrics + 2*(glyph_index - numOfLongHorMetrics));
   }
}